

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::
GenerateSerializedSizeCode(ImmutablePrimitiveOneofFieldLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,
                     "if ($has_oneof_case_message$) {\n  size += com.google.protobuf.CodedOutputStream\n    .compute$capitalized_type$Size(\n        $number$, ($type$)(($boxed_type$) $oneof_name$_));\n}\n"
                    );
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldLiteGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if ($has_oneof_case_message$) {\n"
    "  size += com.google.protobuf.CodedOutputStream\n"
    "    .compute$capitalized_type$Size(\n"
    "        $number$, ($type$)(($boxed_type$) $oneof_name$_));\n"
    "}\n");
}